

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void applyOverrideCursor(QList<QScreen_*> *screens,QCursor *c)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  QScreen **ppQVar3;
  QPlatformScreen *pQVar4;
  undefined4 extraout_var;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QPlatformCursor *cursor;
  QScreen *screen;
  QList<QScreen_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QScreen_*> *in_stack_ffffffffffffffc0;
  const_iterator local_10;
  long local_8;
  long *plVar5;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QScreen **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QScreen_*>::begin(in_stack_ffffffffffffffc0);
  o = QList<QScreen_*>::end(in_stack_ffffffffffffffc0);
  while( true ) {
    bVar1 = QList<QScreen_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    ppQVar3 = QList<QScreen_*>::const_iterator::operator*(&local_10);
    pQVar4 = QScreen::handle(*ppQVar3);
    iVar2 = (*pQVar4->_vptr_QPlatformScreen[0x16])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x70))(plVar5,in_RSI);
    }
    QList<QScreen_*>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void applyOverrideCursor(const QList<QScreen *> &screens, const QCursor &c)
{
    for (QScreen *screen : screens) {
        if (QPlatformCursor *cursor = screen->handle()->cursor())
            cursor->setOverrideCursor(c);
    }
}